

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBuffer.cpp
# Opt level: O3

size_t __thiscall Jupiter::DataBuffer::expandBuffer(DataBuffer *this,size_t size_)

{
  uint8_t *__src;
  uint8_t *puVar1;
  size_t __size;
  size_t __n;
  
  __size = size_ + this->bufferSize;
  this->bufferSize = __size;
  puVar1 = this->base;
  __src = this->head;
  __n = (long)this->end - (long)__src;
  if (puVar1 != __src) {
    memmove(puVar1,__src,__n);
    puVar1 = this->base;
    __size = this->bufferSize;
  }
  puVar1 = (uint8_t *)realloc(puVar1,__size);
  this->base = puVar1;
  this->head = puVar1;
  this->end = puVar1 + __n;
  return this->bufferSize;
}

Assistant:

size_t Jupiter::DataBuffer::expandBuffer(size_t size_) {
	Jupiter::DataBuffer::bufferSize += size_;
	size_ = Jupiter::DataBuffer::end - Jupiter::DataBuffer::head;

	if (Jupiter::DataBuffer::base != Jupiter::DataBuffer::head)
		memmove(Jupiter::DataBuffer::base, Jupiter::DataBuffer::head, size_);

	Jupiter::DataBuffer::base = reinterpret_cast<uint8_t *>(realloc(Jupiter::DataBuffer::base, Jupiter::DataBuffer::bufferSize));
	Jupiter::DataBuffer::head = Jupiter::DataBuffer::base;
	Jupiter::DataBuffer::end = Jupiter::DataBuffer::head + size_;
	return Jupiter::DataBuffer::bufferSize;
}